

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix4.c
# Opt level: O0

char * test_matrix4_multiply_identity(void)

{
  int iVar1;
  undefined1 local_d0 [8];
  matrix4 identity;
  matrix4 m2;
  matrix4 m1;
  
  matrix4_identity((matrix4 *)local_d0);
  _matrix4_set_random((matrix4 *)((long)&m2.field_0 + 0x38));
  matrix4_set((matrix4 *)((long)&identity.field_0 + 0x38),(matrix4 *)((long)&m2.field_0 + 0x38));
  matrix4_multiply((matrix4 *)((long)&identity.field_0 + 0x38),(matrix4 *)local_d0);
  iVar1 = matrix4_equals((matrix4 *)((long)&identity.field_0 + 0x38),
                         (matrix4 *)((long)&m2.field_0 + 0x38));
  if (iVar1 == 0) {
    m1.field_0._56_8_ = anon_var_dwarf_69f;
  }
  else {
    m1.field_0._56_8_ = 0;
  }
  return (char *)m1.field_0._56_8_;
}

Assistant:

static char *test_matrix4_multiply_identity(void)
{
	struct matrix4 m1, m2, identity;

	matrix4_identity(&identity);
	_matrix4_set_random(&m1);

	/* copy m1 -> m2 */
	matrix4_set(&m2, &m1);

	/* m2 = m2 * I */
	matrix4_multiply(&m2, &identity);

	/* equal */
	test_assert(matrix4_equals(&m2, &m1));

	return NULL;
}